

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O0

bool ask_user_bool(char *szPrompt,bool bDefault)

{
  byte in_SIL;
  undefined8 in_RDI;
  bool bVar1;
  char *szSelVals;
  char enter [30];
  char *local_40;
  char local_38 [39];
  byte local_11;
  undefined8 local_10;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_10 = in_RDI;
  memset(local_38,0,0x1e);
  if ((local_11 & 1) == 0) {
    local_40 = "y,<n>";
  }
  else {
    local_40 = "<y>,n";
  }
  do {
    printf("%s (%s): ",local_10,local_40);
    fgets(local_38,0x1d,_stdin);
    bVar1 = false;
    if (((local_38[0] != 'y') && (bVar1 = false, local_38[0] != 'n')) &&
       (bVar1 = false, local_38[0] != '\0')) {
      bVar1 = local_38[0] != '\n';
    }
  } while (bVar1);
  if (local_38[0] == 'n') {
    local_1 = false;
  }
  else if (local_38[0] == 'y') {
    local_1 = true;
  }
  else {
    local_1 = (bool)(local_11 & 1);
  }
  return local_1;
}

Assistant:

bool
ask_user_bool (const char* szPrompt, bool bDefault)
{
    char    enter[30] = "";
    const char *szSelVals;
    if(bDefault){
        szSelVals = "<y>,n";
    }else{
        szSelVals = "y,<n>";
    }

    do{
        printf("%s (%s): ", szPrompt, szSelVals);
        fgets(enter, sizeof(enter)-1, stdin);
    }while('y' != enter[0] && 'n' != enter[0] &&
	   '\0' != enter[0] && '\n' != enter[0]);

    switch(enter[0]){
    case 'y':
        return true;
    case 'n':
        return false;
    }
    return bDefault;
}